

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_search.hpp
# Opt level: O0

int * burst::detail::galloping_search<int_const*,int,std::greater<void>>
                (int *first,int *last,int *value)

{
  anon_class_16_2_ce2e793d __pred;
  bool bVar1;
  difference_type dVar2;
  int *piVar3;
  int *current;
  difference_type step;
  difference_type position;
  difference_type distance;
  int *value_local;
  int *last_local;
  int *first_local;
  
  __pred.compare = (less<void> *)((long)&first_local + 7);
  __pred.value = value;
  bVar1 = std::
          is_partitioned<int_const*,burst::detail::galloping_search<int_const*,int,std::greater<void>>(int_const*,int_const*,int_const&,std::greater<void>)::_lambda(auto:1_const&)_1_>
                    (first,last,__pred);
  if (!bVar1) {
    __assert_fail("std::is_partitioned(first, last, [& value, & compare] (const auto & e) {return compare(e, value);})"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/detail/galloping_search.hpp"
                  ,0x16,
                  "RandomAccessIterator burst::detail::galloping_search(RandomAccessIterator, RandomAccessIterator, const Value &, Compare) [RandomAccessIterator = const int *, Value = int, Compare = std::greater<void>]"
                 );
  }
  dVar2 = std::distance<int_const*>(first,last);
  step = 0;
  current = (int *)0x1;
  last_local = first;
  while( true ) {
    if (dVar2 <= step + (long)current) {
      piVar3 = std::lower_bound<int_const*,int,std::greater<void>>(last_local,last,value);
      return piVar3;
    }
    piVar3 = std::next<int_const*>(last_local,(difference_type)current);
    bVar1 = std::greater<void>::operator()((greater<void> *)((long)&first_local + 7),piVar3,value);
    if (!bVar1) break;
    last_local = std::next<int_const*>(piVar3,1);
    step = (long)current + step + 1;
    current = (int *)((long)current << 1);
  }
  piVar3 = std::lower_bound<int_const*,int,std::greater<void>>(last_local,piVar3,value);
  return piVar3;
}

Assistant:

RandomAccessIterator
            galloping_search
            (
                RandomAccessIterator first, RandomAccessIterator last,
                const Value & value,
                Compare compare
            )
        {
            assert(std::is_partitioned(first, last,
                [& value, & compare] (const auto & e) {return compare(e, value);}));

            const auto distance = std::distance(first, last);

            auto position = static_cast<decltype(distance)>(0);
            auto step = static_cast<decltype(distance)>(1);

            while (position + step < distance)
            {
                const auto current = std::next(first, step);
                if (compare(*current, value))
                {
                    first = std::next(current);
                    position += step + 1;
                    step *= 2;
                }
                else
                {
                    return std::lower_bound(first, current, value, compare);
                }
            }

            return std::lower_bound(first, last, value, compare);
        }